

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O3

void tbl_DrawNextCard(void)

{
  _Bool _Var1;
  Card_t card_00;
  Card_t card_01;
  Card_t card;
  Card_t local_30;
  
  _Var1 = stk_Pop(&PackStack,&local_30);
  if (_Var1) {
    stk_TurnTopCardDown(&RestStack);
    local_30.m_face = CF_UP;
    card_00.m_face = CF_UP;
    card_00.m_type = local_30.m_type;
    card_00.m_color = local_30.m_color;
    stk_PushCopy(&RestStack,card_00);
  }
  else {
    _Var1 = stk_Pop(&RestStack,&local_30);
    if (_Var1) {
      do {
        local_30.m_face = CF_DOWN;
        card_01.m_face = CF_DOWN;
        card_01.m_type = local_30.m_type;
        card_01.m_color = local_30.m_color;
        stk_PushCopy(&PackStack,card_01);
        if (Score < -0x1e847d) {
          Score = -0x1e847e;
        }
        Score = Score + -2;
        _Var1 = stk_Pop(&RestStack,&local_30);
      } while (_Var1);
    }
  }
  return;
}

Assistant:

void tbl_DrawNextCard(void)
{
  Card_t card;
  if (stk_Pop(&PackStack, &card)) {
    stk_TurnTopCardDown(&RestStack);
    card.m_face = CF_UP;
    stk_PushCopy(&RestStack, card);
  } else {
    while (stk_Pop(&RestStack, &card)) {
      card.m_face = CF_DOWN;
      stk_PushCopy(&PackStack, card);
      UpdateScore(-2);
    }
  }
}